

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::GreaterThanEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  const_reference pvVar9;
  long lVar10;
  idx_t iVar11;
  long lVar12;
  idx_t iVar13;
  long lVar14;
  long lVar15;
  idx_t iVar16;
  long lVar17;
  idx_t iVar18;
  bool bVar19;
  idx_t local_78;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      iVar16 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      local_78 = 0;
      iVar18 = 0;
      do {
        iVar13 = iVar18;
        if (psVar5 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar5[iVar18];
        }
        iVar11 = iVar13;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar13];
        }
        lVar8 = *(long *)(pdVar3 + iVar13 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_00adfbf9:
          *no_match_count = iVar16 + 1;
          no_match_sel->sel_vector[iVar16] = (sel_t)iVar13;
          iVar16 = iVar16 + 1;
        }
        else {
          lVar10 = *(long *)(lVar8 + vVar4);
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar15 = iVar11 * 0x10;
          lVar14 = (lVar10 >> 0x20) + lVar8 / 86400000000;
          lVar12 = lVar14 % 0x1e;
          lVar17 = (long)(int)lVar10 + lVar14 / 0x1e;
          lVar14 = (long)*(int *)(pdVar1 + lVar15 + 4) +
                   *(long *)(pdVar1 + lVar15 + 8) / 86400000000;
          lVar10 = lVar14 % 0x1e;
          lVar14 = (long)*(int *)(pdVar1 + lVar15) + lVar14 / 0x1e;
          if ((lVar14 < lVar17) ||
             ((lVar14 <= lVar17 &&
              ((lVar10 < lVar12 ||
               ((lVar10 <= lVar12 &&
                (*(long *)(pdVar1 + lVar15 + 8) % 86400000000 < lVar8 % 86400000000))))))))
          goto LAB_00adfbf9;
          psVar5[local_78] = (sel_t)iVar13;
          local_78 = local_78 + 1;
        }
        iVar18 = iVar18 + 1;
        if (count == iVar18) {
          return local_78;
        }
      } while( true );
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      iVar16 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      local_78 = 0;
      iVar18 = 0;
      do {
        iVar13 = iVar18;
        if (psVar5 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar5[iVar18];
        }
        iVar11 = iVar13;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar13];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar19 = false;
        }
        else {
          bVar19 = (puVar7[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
        }
        if ((bVar19) ||
           (lVar8 = *(long *)(pdVar1 + iVar13 * 8),
           ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_00adfa26:
          *no_match_count = iVar16 + 1;
          no_match_sel->sel_vector[iVar16] = (sel_t)iVar13;
          iVar16 = iVar16 + 1;
        }
        else {
          lVar10 = *(long *)(lVar8 + vVar4);
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar12 = iVar11 * 0x10;
          lVar15 = (lVar10 >> 0x20) + lVar8 / 86400000000;
          lVar17 = lVar15 % 0x1e;
          lVar14 = (long)(int)lVar10 + lVar15 / 0x1e;
          lVar15 = (long)*(int *)(pdVar3 + lVar12 + 4) +
                   *(long *)(pdVar3 + lVar12 + 8) / 86400000000;
          lVar10 = lVar15 % 0x1e;
          lVar15 = (long)*(int *)(pdVar3 + lVar12) + lVar15 / 0x1e;
          if ((lVar15 < lVar14) ||
             ((lVar15 <= lVar14 &&
              ((lVar10 < lVar17 ||
               ((lVar10 <= lVar17 &&
                (*(long *)(pdVar3 + lVar12 + 8) % 86400000000 < lVar8 % 86400000000))))))))
          goto LAB_00adfa26;
          psVar5[local_78] = (sel_t)iVar13;
          local_78 = local_78 + 1;
        }
        iVar18 = iVar18 + 1;
        if (count == iVar18) {
          return local_78;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}